

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void ptls_aead_xor_iv(ptls_aead_context_t *ctx,void *_bytes,size_t len)

{
  ulong local_50;
  size_t i;
  uint8_t iv [32];
  uint8_t *bytes;
  size_t len_local;
  void *_bytes_local;
  ptls_aead_context_t *ctx_local;
  
  iv._24_8_ = _bytes;
  ptls_aead_get_iv(ctx,&i);
  for (local_50 = 0; local_50 < len; local_50 = local_50 + 1) {
    iv[local_50 - 8] = iv[local_50 - 8] ^ *(byte *)(iv._24_8_ + local_50);
  }
  ptls_aead_set_iv(ctx,&i);
  return;
}

Assistant:

void ptls_aead_xor_iv(ptls_aead_context_t *ctx, const void *_bytes, size_t len)
{
    const uint8_t *bytes = _bytes;
    uint8_t iv[PTLS_MAX_IV_SIZE];

    ptls_aead_get_iv(ctx, iv);
    for (size_t i = 0; i < len; ++i)
        iv[i] ^= bytes[i];
    ptls_aead_set_iv(ctx, iv);
}